

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::rec_coface
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          vector<int,_std::allocator<int>_> *vertices,Siblings *curr_sib,int curr_nbVertices,
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          *cofaces,bool star,int nbVertices)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  iterator iVar4;
  iterator __position;
  Vertex_handle tmp;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_40;
  int local_34;
  
  if ((curr_nbVertices <= nbVertices || star) &&
     (local_40.m_ptr =
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
            *)(curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start,
     (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0)) {
    do {
      piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 == piVar3) {
        if (curr_nbVertices == nbVertices || star) {
          iVar4._M_current =
               (cofaces->
               super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (cofaces->
              super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>>
            ::
            _M_realloc_insert<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>const&>
                      ((vector<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>>
                        *)cofaces,iVar4,&local_40);
          }
          else {
            (iVar4._M_current)->m_ptr = local_40.m_ptr;
            (cofaces->
            super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          if (!star) goto LAB_00141b29;
        }
        if ((((local_40.m_ptr)->second).children_)->parent_ == (local_40.m_ptr)->first) {
LAB_00141a80:
          rec_coface(this,vertices,((local_40.m_ptr)->second).children_,curr_nbVertices + 1,cofaces,
                     star,nbVertices);
        }
      }
      else {
        iVar1 = (local_40.m_ptr)->first;
        if (iVar1 == piVar3[-1]) {
          if ((long)piVar3 - (long)piVar2 == 4 && (curr_nbVertices == nbVertices || star)) {
            iVar4._M_current =
                 (cofaces->
                 super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (cofaces->
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>>
              ::
              _M_realloc_insert<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>const&>
                        ((vector<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>>
                          *)cofaces,iVar4,&local_40);
            }
            else {
              (iVar4._M_current)->m_ptr = local_40.m_ptr;
              (cofaces->
              super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            if (!star) goto LAB_00141b29;
          }
          if ((((local_40.m_ptr)->second).children_)->parent_ == (local_40.m_ptr)->first) {
            piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_34 = piVar2[-1];
            (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = piVar2 + -1;
            rec_coface(this,vertices,((local_40.m_ptr)->second).children_,curr_nbVertices + 1,
                       cofaces,star,nbVertices);
            __position._M_current =
                 (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)vertices,__position,&local_34);
            }
            else {
              *__position._M_current = local_34;
              (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        else {
          if (piVar3[-1] < iVar1) {
            return;
          }
          if ((((local_40.m_ptr)->second).children_)->parent_ == iVar1) goto LAB_00141a80;
        }
      }
LAB_00141b29:
      if (local_40.m_ptr ==
          (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
           *)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                      "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, true>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, IsConst = true]"
                     );
      }
      local_40.m_ptr = local_40.m_ptr + 1;
    } while (local_40.m_ptr !=
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)((curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size));
  }
  return;
}

Assistant:

void rec_coface(std::vector<Vertex_handle> &vertices, Siblings const*curr_sib, int curr_nbVertices,
                  std::vector<Simplex_handle>& cofaces, bool star, int nbVertices) const {
    if (!(star || curr_nbVertices <= nbVertices))  // dimension of actual simplex <= nbVertices
      return;
    for (Simplex_handle simplex = curr_sib->members().begin(); simplex != curr_sib->members().end(); ++simplex) {
      if (vertices.empty()) {
        // If we reached the end of the vertices, and the simplex has more vertices than the given simplex
        // => we found a coface

        // Add a coface if we want the star or if the number of vertices of the current simplex matches with nbVertices
        bool addCoface = (star || curr_nbVertices == nbVertices);
        if (addCoface)
          cofaces.push_back(simplex);
        if ((!addCoface || star) && has_children(simplex))  // Rec call
          rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
      } else {
        if (simplex->first == vertices.back()) {
          // If curr_sib matches with the top vertex
          bool equalDim = (star || curr_nbVertices == nbVertices);  // dimension of actual simplex == nbVertices
          bool addCoface = vertices.size() == 1 && equalDim;
          if (addCoface)
            cofaces.push_back(simplex);
          if ((!addCoface || star) && has_children(simplex)) {
            // Rec call
            Vertex_handle tmp = vertices.back();
            vertices.pop_back();
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
            vertices.push_back(tmp);
          }
        } else if (simplex->first > vertices.back()) {
          return;
        } else {
          // (simplex->first < vertices.back()
          if (has_children(simplex))
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
        }
      }
    }
  }